

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3d_DCT_II(float *grbuf,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  drmp3_f4 s_1;
  drmp3_f4 s;
  drmp3_f4 xt;
  drmp3_f4 x7;
  drmp3_f4 x6;
  drmp3_f4 x5;
  drmp3_f4 x4;
  drmp3_f4 x3_1;
  drmp3_f4 x2_1;
  drmp3_f4 x1_1;
  drmp3_f4 x0_1;
  drmp3_f4 t3;
  drmp3_f4 t2;
  drmp3_f4 t1;
  drmp3_f4 t0;
  drmp3_f4 x3;
  drmp3_f4 x2;
  drmp3_f4 x1;
  drmp3_f4 x0;
  float *y;
  drmp3_f4 *x;
  drmp3_f4 t [4] [8];
  int local_c1c;
  int local_c18;
  int k;
  int i;
  int n_local;
  float *grbuf_local;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float local_a08;
  float fStack_a04;
  float local_9f8;
  float fStack_9f4;
  float local_9d8;
  float fStack_9d4;
  float local_9c8;
  float fStack_9c4;
  float local_9b8;
  float fStack_9b4;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  
  local_c1c = 0;
  iVar9 = drmp3_have_simd();
  if (iVar9 != 0) {
    for (; local_c1c < n; local_c1c = local_c1c + 4) {
      x0._8_8_ = grbuf + local_c1c;
      y = (float *)&x;
      for (local_c18 = 0; local_c18 < 8; local_c18 = local_c18 + 1) {
        uVar1 = *(undefined8 *)(x0._8_8_ + (long)(local_c18 * 0x12) * 4);
        uVar2 = *(undefined8 *)((float *)(x0._8_8_ + (long)(local_c18 * 0x12) * 4) + 2);
        uVar3 = *(undefined8 *)(x0._8_8_ + (long)((0xf - local_c18) * 0x12) * 4);
        uVar4 = *(undefined8 *)((float *)(x0._8_8_ + (long)((0xf - local_c18) * 0x12) * 4) + 2);
        uVar5 = *(undefined8 *)(x0._8_8_ + (long)(local_c18 * 0x12 + 0x120) * 4);
        uVar6 = *(undefined8 *)((float *)(x0._8_8_ + (long)(local_c18 * 0x12 + 0x120) * 4) + 2);
        uVar7 = *(undefined8 *)(x0._8_8_ + (long)((0x1f - local_c18) * 0x12) * 4);
        uVar8 = *(undefined8 *)((float *)(x0._8_8_ + (long)((0x1f - local_c18) * 0x12) * 4) + 2);
        local_738 = (float)uVar1;
        fStack_734 = (float)((ulong)uVar1 >> 0x20);
        fStack_730 = (float)uVar2;
        fStack_72c = (float)((ulong)uVar2 >> 0x20);
        local_748 = (float)uVar7;
        fStack_744 = (float)((ulong)uVar7 >> 0x20);
        fStack_740 = (float)uVar8;
        fStack_73c = (float)((ulong)uVar8 >> 0x20);
        local_758 = (float)uVar3;
        fStack_754 = (float)((ulong)uVar3 >> 0x20);
        fStack_750 = (float)uVar4;
        fStack_74c = (float)((ulong)uVar4 >> 0x20);
        local_768 = (float)uVar5;
        fStack_764 = (float)((ulong)uVar5 >> 0x20);
        fStack_760 = (float)uVar6;
        fStack_75c = (float)((ulong)uVar6 >> 0x20);
        fVar27 = drmp3d_DCT_II::g_sec[local_c18 * 3];
        fVar10 = (local_758 - local_768) * fVar27;
        fVar13 = (fStack_754 - fStack_764) * fVar27;
        fVar18 = (fStack_750 - fStack_760) * fVar27;
        fVar27 = (fStack_74c - fStack_75c) * fVar27;
        fVar28 = drmp3d_DCT_II::g_sec[(long)(local_c18 * 3) + 1];
        fVar11 = (local_738 - local_748) * fVar28;
        fVar14 = (fStack_734 - fStack_744) * fVar28;
        fVar19 = (fStack_730 - fStack_740) * fVar28;
        fVar28 = (fStack_72c - fStack_73c) * fVar28;
        *y = local_738 + local_748 + local_758 + local_768;
        y[1] = fStack_734 + fStack_744 + fStack_754 + fStack_764;
        y[2] = fStack_730 + fStack_740 + fStack_750 + fStack_760;
        y[3] = fStack_72c + fStack_73c + fStack_74c + fStack_75c;
        fVar12 = drmp3d_DCT_II::g_sec[(long)(local_c18 * 3) + 2];
        y[0x20] = ((local_738 + local_748) - (local_758 + local_768)) * fVar12;
        y[0x21] = ((fStack_734 + fStack_744) - (fStack_754 + fStack_764)) * fVar12;
        y[0x22] = ((fStack_730 + fStack_740) - (fStack_750 + fStack_760)) * fVar12;
        y[0x23] = ((fStack_72c + fStack_73c) - (fStack_74c + fStack_75c)) * fVar12;
        y[0x40] = fVar11 + fVar10;
        y[0x41] = fVar14 + fVar13;
        y[0x42] = fVar19 + fVar18;
        y[0x43] = fVar28 + fVar27;
        fVar12 = drmp3d_DCT_II::g_sec[(long)(local_c18 * 3) + 2];
        y[0x60] = (fVar11 - fVar10) * fVar12;
        y[0x61] = (fVar14 - fVar13) * fVar12;
        y[0x62] = (fVar19 - fVar18) * fVar12;
        y[99] = (fVar28 - fVar27) * fVar12;
        y = y + 4;
      }
      y = (float *)&x;
      for (local_c18 = 0; local_c18 < 4; local_c18 = local_c18 + 1) {
        local_598 = (float)*(undefined8 *)y;
        fStack_594 = (float)((ulong)*(undefined8 *)y >> 0x20);
        fStack_590 = (float)*(undefined8 *)(y + 2);
        fStack_58c = (float)((ulong)*(undefined8 *)(y + 2) >> 0x20);
        local_5a8 = (float)*(undefined8 *)(y + 0x1c);
        fStack_5a4 = (float)((ulong)*(undefined8 *)(y + 0x1c) >> 0x20);
        fStack_5a0 = (float)*(undefined8 *)(y + 0x1e);
        fStack_59c = (float)((ulong)*(undefined8 *)(y + 0x1e) >> 0x20);
        fVar14 = local_598 - local_5a8;
        fVar15 = fStack_594 - fStack_5a4;
        fVar20 = fStack_590 - fStack_5a0;
        fVar29 = fStack_58c - fStack_59c;
        local_5b8 = (float)*(undefined8 *)(y + 4);
        fStack_5b4 = (float)((ulong)*(undefined8 *)(y + 4) >> 0x20);
        fStack_5b0 = (float)*(undefined8 *)(y + 6);
        fStack_5ac = (float)((ulong)*(undefined8 *)(y + 6) >> 0x20);
        local_5c8 = (float)*(undefined8 *)(y + 0x18);
        fStack_5c4 = (float)((ulong)*(undefined8 *)(y + 0x18) >> 0x20);
        fStack_5c0 = (float)*(undefined8 *)(y + 0x1a);
        fStack_5bc = (float)((ulong)*(undefined8 *)(y + 0x1a) >> 0x20);
        local_5d8 = (float)*(undefined8 *)(y + 8);
        fStack_5d4 = (float)((ulong)*(undefined8 *)(y + 8) >> 0x20);
        fStack_5d0 = (float)*(undefined8 *)(y + 10);
        fStack_5cc = (float)((ulong)*(undefined8 *)(y + 10) >> 0x20);
        local_5e8 = (float)*(undefined8 *)(y + 0x14);
        fStack_5e4 = (float)((ulong)*(undefined8 *)(y + 0x14) >> 0x20);
        fStack_5e0 = (float)*(undefined8 *)(y + 0x16);
        fStack_5dc = (float)((ulong)*(undefined8 *)(y + 0x16) >> 0x20);
        local_5f8 = (float)*(undefined8 *)(y + 0xc);
        fStack_5f4 = (float)((ulong)*(undefined8 *)(y + 0xc) >> 0x20);
        fStack_5f0 = (float)*(undefined8 *)(y + 0xe);
        fStack_5ec = (float)((ulong)*(undefined8 *)(y + 0xe) >> 0x20);
        local_608 = (float)*(undefined8 *)(y + 0x10);
        fStack_604 = (float)((ulong)*(undefined8 *)(y + 0x10) >> 0x20);
        fStack_600 = (float)*(undefined8 *)(y + 0x12);
        fStack_5fc = (float)((ulong)*(undefined8 *)(y + 0x12) >> 0x20);
        fVar27 = (local_598 + local_5a8) - (local_5f8 + local_608);
        fVar18 = (fStack_594 + fStack_5a4) - (fStack_5f4 + fStack_604);
        fVar21 = (fStack_590 + fStack_5a0) - (fStack_5f0 + fStack_600);
        fVar30 = (fStack_58c + fStack_59c) - (fStack_5ec + fStack_5fc);
        fVar28 = local_598 + local_5a8 + local_5f8 + local_608;
        fVar10 = fStack_594 + fStack_5a4 + fStack_5f4 + fStack_604;
        fVar13 = fStack_590 + fStack_5a0 + fStack_5f0 + fStack_600;
        fVar31 = fStack_58c + fStack_59c + fStack_5ec + fStack_5fc;
        fVar12 = local_5b8 + local_5c8 + local_5d8 + local_5e8;
        fVar11 = fStack_5b4 + fStack_5c4 + fStack_5d4 + fStack_5e4;
        fVar19 = fStack_5b0 + fStack_5c0 + fStack_5d0 + fStack_5e0;
        fVar32 = fStack_5ac + fStack_5bc + fStack_5cc + fStack_5dc;
        *y = fVar28 + fVar12;
        y[1] = fVar10 + fVar11;
        y[2] = fVar13 + fVar19;
        y[3] = fVar31 + fVar32;
        y[0x10] = (fVar28 - fVar12) * 0.70710677;
        y[0x11] = (fVar10 - fVar11) * 0.70710677;
        y[0x12] = (fVar13 - fVar19) * 0.70710677;
        y[0x13] = (fVar31 - fVar32) * 0.70710677;
        fVar28 = ((local_5d8 - local_5e8) + (local_5b8 - local_5c8)) * 0.70710677;
        fVar19 = ((fStack_5d4 - fStack_5e4) + (fStack_5b4 - fStack_5c4)) * 0.70710677;
        fVar22 = ((fStack_5d0 - fStack_5e0) + (fStack_5b0 - fStack_5c0)) * 0.70710677;
        fVar33 = ((fStack_5cc - fStack_5dc) + (fStack_5ac - fStack_5bc)) * 0.70710677;
        fVar10 = (local_5b8 - local_5c8) + fVar14;
        fVar32 = (fStack_5b4 - fStack_5c4) + fVar15;
        fVar23 = (fStack_5b0 - fStack_5c0) + fVar20;
        fVar34 = (fStack_5ac - fStack_5bc) + fVar29;
        fVar12 = (((local_5b8 + local_5c8) - (local_5d8 + local_5e8)) + fVar27) * 0.70710677;
        fVar31 = (((fStack_5b4 + fStack_5c4) - (fStack_5d4 + fStack_5e4)) + fVar18) * 0.70710677;
        fVar24 = (((fStack_5b0 + fStack_5c0) - (fStack_5d0 + fStack_5e0)) + fVar21) * 0.70710677;
        fVar35 = (((fStack_5ac + fStack_5bc) - (fStack_5cc + fStack_5dc)) + fVar30) * 0.70710677;
        fVar11 = ((local_5f8 - local_608) + (local_5d8 - local_5e8)) - fVar10 * 0.19891237;
        fVar16 = ((fStack_5f4 - fStack_604) + (fStack_5d4 - fStack_5e4)) - fVar32 * 0.19891237;
        fVar25 = ((fStack_5f0 - fStack_600) + (fStack_5d0 - fStack_5e0)) - fVar23 * 0.19891237;
        fVar36 = ((fStack_5ec - fStack_5fc) + (fStack_5cc - fStack_5dc)) - fVar34 * 0.19891237;
        fVar10 = fVar10 + fVar11 * 0.38268343;
        fVar32 = fVar32 + fVar16 * 0.38268343;
        fVar23 = fVar23 + fVar25 * 0.38268343;
        fVar34 = fVar34 + fVar36 * 0.38268343;
        fVar11 = fVar11 - fVar10 * 0.19891237;
        fVar16 = fVar16 - fVar32 * 0.19891237;
        fVar25 = fVar25 - fVar23 * 0.19891237;
        fVar36 = fVar36 - fVar34 * 0.19891237;
        fVar13 = fVar14 - fVar28;
        fVar17 = fVar15 - fVar19;
        fVar26 = fVar20 - fVar22;
        fVar37 = fVar29 - fVar33;
        fVar14 = fVar14 + fVar28;
        fVar15 = fVar15 + fVar19;
        fVar20 = fVar20 + fVar22;
        fVar29 = fVar29 + fVar33;
        y[4] = (fVar14 + fVar10) * 0.5097956;
        y[5] = (fVar15 + fVar32) * 0.5097956;
        y[6] = (fVar20 + fVar23) * 0.5097956;
        y[7] = (fVar29 + fVar34) * 0.5097956;
        y[8] = (fVar27 + fVar12) * 0.5411961;
        y[9] = (fVar18 + fVar31) * 0.5411961;
        y[10] = (fVar21 + fVar24) * 0.5411961;
        y[0xb] = (fVar30 + fVar35) * 0.5411961;
        y[0xc] = (fVar13 - fVar11) * 0.6013449;
        y[0xd] = (fVar17 - fVar16) * 0.6013449;
        y[0xe] = (fVar26 - fVar25) * 0.6013449;
        y[0xf] = (fVar37 - fVar36) * 0.6013449;
        y[0x14] = (fVar13 + fVar11) * 0.8999762;
        y[0x15] = (fVar17 + fVar16) * 0.8999762;
        y[0x16] = (fVar26 + fVar25) * 0.8999762;
        y[0x17] = (fVar37 + fVar36) * 0.8999762;
        y[0x18] = (fVar27 - fVar12) * 1.306563;
        y[0x19] = (fVar18 - fVar31) * 1.306563;
        y[0x1a] = (fVar21 - fVar24) * 1.306563;
        y[0x1b] = (fVar30 - fVar35) * 1.306563;
        y[0x1c] = (fVar14 - fVar10) * 2.5629156;
        y[0x1d] = (fVar15 - fVar32) * 2.5629156;
        y[0x1e] = (fVar20 - fVar23) * 2.5629156;
        y[0x1f] = (fVar29 - fVar34) * 2.5629156;
        y = y + 0x20;
      }
      local_a38 = (float)t[2][6]._8_8_;
      fStack_a34 = SUB84(t[2][6]._8_8_,4);
      fStack_a30 = (float)t[2][7]._0_8_;
      fStack_a2c = SUB84(t[2][7]._0_8_,4);
      local_a48 = (float)t[3][6]._8_8_;
      fStack_a44 = SUB84(t[3][6]._8_8_,4);
      fStack_a40 = (float)t[3][7]._0_8_;
      fStack_a3c = SUB84(t[3][7]._0_8_,4);
      if (n + -3 < local_c1c) {
        for (local_c18 = 0; local_c18 < 7; local_c18 = local_c18 + 1) {
          uVar1 = *(undefined8 *)(t[2][(long)local_c18 + 7] + 2);
          uVar2 = *(undefined8 *)(t[3][local_c18] + 2);
          local_9b8 = (float)uVar1;
          fStack_9b4 = (float)((ulong)uVar1 >> 0x20);
          local_9c8 = (float)uVar2;
          fStack_9c4 = (float)((ulong)uVar2 >> 0x20);
          *(undefined8 *)x0._8_8_ = *(undefined8 *)(t[-1][(long)local_c18 + 7] + 2);
          uVar1 = *(undefined8 *)(t[1][(long)local_c18 + 7] + 2);
          local_9d8 = (float)uVar1;
          fStack_9d4 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)(x0._8_8_ + 0x48) =
               CONCAT44(fStack_9d4 + fStack_9b4 + fStack_9c4,local_9d8 + local_9b8 + local_9c8);
          uVar1 = *(undefined8 *)(t[0][(long)local_c18 + 7] + 2);
          uVar2 = *(undefined8 *)(t[1][local_c18] + 2);
          local_9f8 = (float)uVar1;
          fStack_9f4 = (float)((ulong)uVar1 >> 0x20);
          local_a08 = (float)uVar2;
          fStack_a04 = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)(x0._8_8_ + 0x90) = CONCAT44(fStack_9f4 + fStack_a04,local_9f8 + local_a08);
          uVar1 = *(undefined8 *)(t[2][local_c18] + 2);
          local_a18 = (float)uVar1;
          fStack_a14 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)(x0._8_8_ + 0xd8) =
               CONCAT44(fStack_a14 + fStack_9b4 + fStack_9c4,local_a18 + local_9b8 + local_9c8);
          x0._8_8_ = x0._8_8_ + 0x120;
        }
        *(undefined8 *)x0._8_8_ = t[0][6]._8_8_;
        *(ulong *)(x0._8_8_ + 0x48) = CONCAT44(fStack_a34 + fStack_a44,local_a38 + local_a48);
        *(undefined8 *)(x0._8_8_ + 0x90) = t[1][6]._8_8_;
        *(undefined8 *)(x0._8_8_ + 0xd8) = t[3][6]._8_8_;
      }
      else {
        for (local_c18 = 0; local_c18 < 7; local_c18 = local_c18 + 1) {
          uVar1 = *(undefined8 *)(t[2][(long)local_c18 + 7] + 2);
          uVar2 = *(undefined8 *)t[3][local_c18];
          uVar3 = *(undefined8 *)(t[2][(long)(local_c18 + 1) + 7] + 2);
          uVar4 = *(undefined8 *)t[3][local_c18 + 1];
          local_a58 = (float)uVar1;
          fStack_a54 = (float)((ulong)uVar1 >> 0x20);
          fStack_a50 = (float)uVar2;
          fStack_a4c = (float)((ulong)uVar2 >> 0x20);
          local_a68 = (float)uVar3;
          fStack_a64 = (float)((ulong)uVar3 >> 0x20);
          fStack_a60 = (float)uVar4;
          fStack_a5c = (float)((ulong)uVar4 >> 0x20);
          uVar1 = *(undefined8 *)t[0][local_c18];
          *(undefined8 *)x0._8_8_ = *(undefined8 *)(t[-1][(long)local_c18 + 7] + 2);
          *(undefined8 *)(x0._8_8_ + 8) = uVar1;
          uVar1 = *(undefined8 *)(t[1][(long)local_c18 + 7] + 2);
          uVar2 = *(undefined8 *)t[2][local_c18];
          local_a78 = (float)uVar1;
          fStack_a74 = (float)((ulong)uVar1 >> 0x20);
          fStack_a70 = (float)uVar2;
          fStack_a6c = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)(x0._8_8_ + 0x48) =
               CONCAT44(fStack_a74 + fStack_a54 + fStack_a64,local_a78 + local_a58 + local_a68);
          *(ulong *)(x0._8_8_ + 0x50) =
               CONCAT44(fStack_a6c + fStack_a4c + fStack_a5c,fStack_a70 + fStack_a50 + fStack_a60);
          uVar1 = *(undefined8 *)(t[0][(long)local_c18 + 7] + 2);
          uVar2 = *(undefined8 *)t[1][local_c18];
          uVar3 = *(undefined8 *)(t[0][(long)(local_c18 + 1) + 7] + 2);
          uVar4 = *(undefined8 *)t[1][local_c18 + 1];
          local_a98 = (float)uVar1;
          fStack_a94 = (float)((ulong)uVar1 >> 0x20);
          fStack_a90 = (float)uVar2;
          fStack_a8c = (float)((ulong)uVar2 >> 0x20);
          local_aa8 = (float)uVar3;
          fStack_aa4 = (float)((ulong)uVar3 >> 0x20);
          fStack_aa0 = (float)uVar4;
          fStack_a9c = (float)((ulong)uVar4 >> 0x20);
          *(ulong *)(x0._8_8_ + 0x90) = CONCAT44(fStack_a94 + fStack_aa4,local_a98 + local_aa8);
          *(ulong *)(x0._8_8_ + 0x98) = CONCAT44(fStack_a8c + fStack_a9c,fStack_a90 + fStack_aa0);
          uVar1 = *(undefined8 *)(t[1][(long)(local_c18 + 1) + 7] + 2);
          uVar2 = *(undefined8 *)t[2][local_c18 + 1];
          local_ab8 = (float)uVar1;
          fStack_ab4 = (float)((ulong)uVar1 >> 0x20);
          fStack_ab0 = (float)uVar2;
          fStack_aac = (float)((ulong)uVar2 >> 0x20);
          *(ulong *)(x0._8_8_ + 0xd8) =
               CONCAT44(fStack_ab4 + fStack_a54 + fStack_a64,local_ab8 + local_a58 + local_a68);
          *(ulong *)(x0._8_8_ + 0xe0) =
               CONCAT44(fStack_aac + fStack_a4c + fStack_a5c,fStack_ab0 + fStack_a50 + fStack_a60);
          x0._8_8_ = x0._8_8_ + 0x120;
        }
        *(undefined8 *)x0._8_8_ = t[0][6]._8_8_;
        *(undefined8 *)(x0._8_8_ + 8) = t[0][7]._0_8_;
        *(ulong *)(x0._8_8_ + 0x48) = CONCAT44(fStack_a34 + fStack_a44,local_a38 + local_a48);
        *(ulong *)(x0._8_8_ + 0x50) = CONCAT44(fStack_a2c + fStack_a3c,fStack_a30 + fStack_a40);
        *(undefined8 *)(x0._8_8_ + 0x90) = t[1][6]._8_8_;
        *(undefined8 *)(x0._8_8_ + 0x98) = t[1][7]._0_8_;
        *(undefined8 *)(x0._8_8_ + 0xd8) = t[3][6]._8_8_;
        *(undefined8 *)(x0._8_8_ + 0xe0) = t[3][7]._0_8_;
      }
    }
  }
  return;
}

Assistant:

static void drmp3d_DCT_II(float *grbuf, int n)
{
    static const float g_sec[24] = {
        10.19000816f,0.50060302f,0.50241929f,3.40760851f,0.50547093f,0.52249861f,2.05778098f,0.51544732f,0.56694406f,1.48416460f,0.53104258f,0.64682180f,1.16943991f,0.55310392f,0.78815460f,0.97256821f,0.58293498f,1.06067765f,0.83934963f,0.62250412f,1.72244716f,0.74453628f,0.67480832f,5.10114861f
    };
    int i, k = 0;
#if DRMP3_HAVE_SIMD
    if (drmp3_have_simd()) for (; k < n; k += 4)
    {
        drmp3_f4 t[4][8], *x;
        float *y = grbuf + k;

        for (x = t[0], i = 0; i < 8; i++, x++)
        {
            drmp3_f4 x0 = DRMP3_VLD(&y[i*18]);
            drmp3_f4 x1 = DRMP3_VLD(&y[(15 - i)*18]);
            drmp3_f4 x2 = DRMP3_VLD(&y[(16 + i)*18]);
            drmp3_f4 x3 = DRMP3_VLD(&y[(31 - i)*18]);
            drmp3_f4 t0 = DRMP3_VADD(x0, x3);
            drmp3_f4 t1 = DRMP3_VADD(x1, x2);
            drmp3_f4 t2 = DRMP3_VMUL_S(DRMP3_VSUB(x1, x2), g_sec[3*i + 0]);
            drmp3_f4 t3 = DRMP3_VMUL_S(DRMP3_VSUB(x0, x3), g_sec[3*i + 1]);
            x[0] = DRMP3_VADD(t0, t1);
            x[8] = DRMP3_VMUL_S(DRMP3_VSUB(t0, t1), g_sec[3*i + 2]);
            x[16] = DRMP3_VADD(t3, t2);
            x[24] = DRMP3_VMUL_S(DRMP3_VSUB(t3, t2), g_sec[3*i + 2]);
        }
        for (x = t[0], i = 0; i < 4; i++, x += 8)
        {
            drmp3_f4 x0 = x[0], x1 = x[1], x2 = x[2], x3 = x[3], x4 = x[4], x5 = x[5], x6 = x[6], x7 = x[7], xt;
            xt = DRMP3_VSUB(x0, x7); x0 = DRMP3_VADD(x0, x7);
            x7 = DRMP3_VSUB(x1, x6); x1 = DRMP3_VADD(x1, x6);
            x6 = DRMP3_VSUB(x2, x5); x2 = DRMP3_VADD(x2, x5);
            x5 = DRMP3_VSUB(x3, x4); x3 = DRMP3_VADD(x3, x4);
            x4 = DRMP3_VSUB(x0, x3); x0 = DRMP3_VADD(x0, x3);
            x3 = DRMP3_VSUB(x1, x2); x1 = DRMP3_VADD(x1, x2);
            x[0] = DRMP3_VADD(x0, x1);
            x[4] = DRMP3_VMUL_S(DRMP3_VSUB(x0, x1), 0.70710677f);
            x5 = DRMP3_VADD(x5, x6);
            x6 = DRMP3_VMUL_S(DRMP3_VADD(x6, x7), 0.70710677f);
            x7 = DRMP3_VADD(x7, xt);
            x3 = DRMP3_VMUL_S(DRMP3_VADD(x3, x4), 0.70710677f);
            x5 = DRMP3_VSUB(x5, DRMP3_VMUL_S(x7, 0.198912367f)); /* rotate by PI/8 */
            x7 = DRMP3_VADD(x7, DRMP3_VMUL_S(x5, 0.382683432f));
            x5 = DRMP3_VSUB(x5, DRMP3_VMUL_S(x7, 0.198912367f));
            x0 = DRMP3_VSUB(xt, x6); xt = DRMP3_VADD(xt, x6);
            x[1] = DRMP3_VMUL_S(DRMP3_VADD(xt, x7), 0.50979561f);
            x[2] = DRMP3_VMUL_S(DRMP3_VADD(x4, x3), 0.54119611f);
            x[3] = DRMP3_VMUL_S(DRMP3_VSUB(x0, x5), 0.60134488f);
            x[5] = DRMP3_VMUL_S(DRMP3_VADD(x0, x5), 0.89997619f);
            x[6] = DRMP3_VMUL_S(DRMP3_VSUB(x4, x3), 1.30656302f);
            x[7] = DRMP3_VMUL_S(DRMP3_VSUB(xt, x7), 2.56291556f);
        }

        if (k > n - 3)
        {
#if DRMP3_HAVE_SSE
#define DRMP3_VSAVE2(i, v) _mm_storel_pi((__m64 *)(void*)&y[i*18], v)
#else
#define DRMP3_VSAVE2(i, v) vst1_f32((float32_t *)&y[(i)*18],  vget_low_f32(v))
#endif
            for (i = 0; i < 7; i++, y += 4*18)
            {
                drmp3_f4 s = DRMP3_VADD(t[3][i], t[3][i + 1]);
                DRMP3_VSAVE2(0, t[0][i]);
                DRMP3_VSAVE2(1, DRMP3_VADD(t[2][i], s));
                DRMP3_VSAVE2(2, DRMP3_VADD(t[1][i], t[1][i + 1]));
                DRMP3_VSAVE2(3, DRMP3_VADD(t[2][1 + i], s));
            }
            DRMP3_VSAVE2(0, t[0][7]);
            DRMP3_VSAVE2(1, DRMP3_VADD(t[2][7], t[3][7]));
            DRMP3_VSAVE2(2, t[1][7]);
            DRMP3_VSAVE2(3, t[3][7]);
        } else
        {
#define DRMP3_VSAVE4(i, v) DRMP3_VSTORE(&y[(i)*18], v)
            for (i = 0; i < 7; i++, y += 4*18)
            {
                drmp3_f4 s = DRMP3_VADD(t[3][i], t[3][i + 1]);
                DRMP3_VSAVE4(0, t[0][i]);
                DRMP3_VSAVE4(1, DRMP3_VADD(t[2][i], s));
                DRMP3_VSAVE4(2, DRMP3_VADD(t[1][i], t[1][i + 1]));
                DRMP3_VSAVE4(3, DRMP3_VADD(t[2][1 + i], s));
            }
            DRMP3_VSAVE4(0, t[0][7]);
            DRMP3_VSAVE4(1, DRMP3_VADD(t[2][7], t[3][7]));
            DRMP3_VSAVE4(2, t[1][7]);
            DRMP3_VSAVE4(3, t[3][7]);
        }
    } else
#endif
#ifdef DR_MP3_ONLY_SIMD
    {} /* for HAVE_SIMD=1, MINIMP3_ONLY_SIMD=1 case we do not need non-intrinsic "else" branch */
#else
    for (; k < n; k++)
    {
        float t[4][8], *x, *y = grbuf + k;

        for (x = t[0], i = 0; i < 8; i++, x++)
        {
            float x0 = y[i*18];
            float x1 = y[(15 - i)*18];
            float x2 = y[(16 + i)*18];
            float x3 = y[(31 - i)*18];
            float t0 = x0 + x3;
            float t1 = x1 + x2;
            float t2 = (x1 - x2)*g_sec[3*i + 0];
            float t3 = (x0 - x3)*g_sec[3*i + 1];
            x[0] = t0 + t1;
            x[8] = (t0 - t1)*g_sec[3*i + 2];
            x[16] = t3 + t2;
            x[24] = (t3 - t2)*g_sec[3*i + 2];
        }
        for (x = t[0], i = 0; i < 4; i++, x += 8)
        {
            float x0 = x[0], x1 = x[1], x2 = x[2], x3 = x[3], x4 = x[4], x5 = x[5], x6 = x[6], x7 = x[7], xt;
            xt = x0 - x7; x0 += x7;
            x7 = x1 - x6; x1 += x6;
            x6 = x2 - x5; x2 += x5;
            x5 = x3 - x4; x3 += x4;
            x4 = x0 - x3; x0 += x3;
            x3 = x1 - x2; x1 += x2;
            x[0] = x0 + x1;
            x[4] = (x0 - x1)*0.70710677f;
            x5 =  x5 + x6;
            x6 = (x6 + x7)*0.70710677f;
            x7 =  x7 + xt;
            x3 = (x3 + x4)*0.70710677f;
            x5 -= x7*0.198912367f;  /* rotate by PI/8 */
            x7 += x5*0.382683432f;
            x5 -= x7*0.198912367f;
            x0 = xt - x6; xt += x6;
            x[1] = (xt + x7)*0.50979561f;
            x[2] = (x4 + x3)*0.54119611f;
            x[3] = (x0 - x5)*0.60134488f;
            x[5] = (x0 + x5)*0.89997619f;
            x[6] = (x4 - x3)*1.30656302f;
            x[7] = (xt - x7)*2.56291556f;

        }
        for (i = 0; i < 7; i++, y += 4*18)
        {
            y[0*18] = t[0][i];
            y[1*18] = t[2][i] + t[3][i] + t[3][i + 1];
            y[2*18] = t[1][i] + t[1][i + 1];
            y[3*18] = t[2][i + 1] + t[3][i] + t[3][i + 1];
        }
        y[0*18] = t[0][7];
        y[1*18] = t[2][7] + t[3][7];
        y[2*18] = t[1][7];
        y[3*18] = t[3][7];
    }
#endif
}